

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall efsw::String::String(String *this,string *ansiString,locale *locale)

{
  long lVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  back_insert_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  output;
  locale *locale_local;
  string *ansiString_local;
  String *this_local;
  
  std::__cxx11::u32string::u32string((u32string *)this);
  lVar1 = std::__cxx11::string::length();
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  reserve(&this->mString,lVar1 + 1);
  begin._M_current = (char *)std::__cxx11::string::begin();
  end._M_current = (char *)std::__cxx11::string::end();
  output = std::back_inserter<std::__cxx11::u32string>(&this->mString);
  Utf<32u>::
  FromAnsi<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::u32string>>
            (begin,end,output,locale);
  return;
}

Assistant:

String::String( const std::string& ansiString, const std::locale& locale ) {
	mString.reserve( ansiString.length() + 1 );
	Utf32::FromAnsi( ansiString.begin(), ansiString.end(), std::back_inserter( mString ), locale );
}